

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::ArgumentsValue::get_named(Value *__return_storage_ptr__,ArgumentsValue *this,string *name)

{
  pointer ppVar1;
  __type_conflict1 _Var2;
  pointer __lhs;
  
  __lhs = (this->kwargs).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->kwargs).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == ppVar1) {
      Value::Value(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    _Var2 = std::operator==(&__lhs->first,name);
    if (_Var2) break;
    __lhs = __lhs + 1;
  }
  Value::Value(__return_storage_ptr__,&__lhs->second);
  return __return_storage_ptr__;
}

Assistant:

Value get_named(const std::string & name) {
    for (const auto & [key, value] : kwargs) {
      if (key == name) return value;
    }
    return Value();
  }